

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utf8.c
# Opt level: O2

_Bool dotest(char *file,int line,char *input,unsigned_long *chars,size_t nchars)

{
  byte *pbVar1;
  size_t sVar2;
  unsigned_long uVar3;
  _Bool _Var4;
  ulong uVar5;
  char *__format;
  byte *pbVar6;
  byte *local_48;
  unsigned_long *local_40;
  byte *local_38;
  
  local_48 = (byte *)input;
  local_40 = chars;
  sVar2 = strlen(input);
  local_38 = (byte *)(input + sVar2 + 1);
  printf("%s:%d: test start\n",file,line);
  uVar5 = 0;
  pbVar6 = (byte *)input;
  do {
    if (local_38 <= pbVar6) {
      if (uVar5 < nchars) {
        __format = "%s:%d: FAIL: expected further output\n";
LAB_00101338:
        _Var4 = false;
        printf(__format,file,(ulong)(uint)line);
      }
      else {
        printf("%s:%d: pass\n",file,(ulong)(uint)line);
        _Var4 = true;
      }
      return _Var4;
    }
    uVar3 = decode_utf8((char **)&local_48);
    printf("%s:%d in+%zu out+%zu:",file,(ulong)(uint)line,(long)pbVar6 - (long)input,uVar5);
    pbVar1 = local_48;
    for (; pbVar6 < pbVar1; pbVar6 = pbVar6 + 1) {
      printf(" %02x",(ulong)*pbVar6);
    }
    printf(" -> U-%08lx\n",uVar3);
    if (uVar5 == nchars) {
      __format = "%s:%d: FAIL: expected no further output\n";
      goto LAB_00101338;
    }
    if (local_40[uVar5] != uVar3) {
      printf("%s:%d: FAIL: expected U-%08lx\n",file,(ulong)(uint)line);
      return false;
    }
    uVar5 = uVar5 + 1;
    pbVar6 = pbVar1;
  } while( true );
}

Assistant:

bool dotest(const char *file, int line, const char *input,
            const unsigned long *chars, size_t nchars)
{
    const char *start = input;
    const char *end = input + strlen(input) + 1;
    size_t noutput = 0;

    printf("%s:%d: test start\n", file, line);

    while (input < end) {
        const char *before = input;
        unsigned long wc = decode_utf8(&input);

        printf("%s:%d in+%"SIZEu" out+%"SIZEu":",
               file, line, (size_t)(before-start), noutput);
        while (before < input)
            printf(" %02x", (unsigned)(unsigned char)(*before++));
        printf(" -> U-%08lx\n", wc);

        if (noutput >= nchars) {
            printf("%s:%d: FAIL: expected no further output\n", file, line);
            return false;
        }

        if (chars[noutput] != wc) {
            printf("%s:%d: FAIL: expected U-%08lx\n",
                   file, line, chars[noutput]);
            return false;
        }

        noutput++;
    }

    if (noutput < nchars) {
        printf("%s:%d: FAIL: expected further output\n", file, line);
        return false;
    }

    printf("%s:%d: pass\n", file, line);
    return true;
}